

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<int_const&>::operator<=
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,
          value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *rhs)

{
  lest *this_00;
  value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *in_R8;
  allocator<char> local_69;
  string local_68 [32];
  string local_48;
  bool local_21;
  string *local_20;
  value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *rhs_local;
  expression_lhs<const_int_&> *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_std::default_delete<int>_> *
              )this;
  this_local = (expression_lhs<const_int_&> *)__return_storage_ptr__;
  local_21 = nonstd::vptr::operator<=(*(int **)this,rhs);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_68,"<=",&local_69);
  to_string<int,nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,std::default_delete<int>>>
            (&local_48,this_00,(int *)local_68,local_20,in_R8);
  result::result<bool>(__return_storage_ptr__,&local_21,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

result operator<=( R const & rhs ) { return result( lhs <= rhs, to_string( lhs, "<=", rhs ) ); }